

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.cpp
# Opt level: O2

void __thiscall
groundupdbext::DefaultQueryResult::DefaultQueryResult(DefaultQueryResult *this,Set *recordKeys)

{
  _Insert<groundupdb::HashedValue,_groundupdb::HashedValue,_std::allocator<groundupdb::HashedValue>,_std::__detail::_Identity,_std::equal_to<groundupdb::HashedValue>,_std::hash<groundupdb::HashedValue>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
  *this_00;
  __node_base *p_Var1;
  HashedValue HStack_58;
  
  (this->super_IQueryResult)._vptr_IQueryResult = (_func_int **)&PTR__DefaultQueryResult_00138aa8;
  std::
  make_unique<std::unordered_set<groundupdb::HashedValue,std::hash<groundupdb::HashedValue>,std::equal_to<groundupdb::HashedValue>,std::allocator<groundupdb::HashedValue>>>
            ();
  std::__detail::
  _Rehash_base<groundupdb::HashedValue,_groundupdb::HashedValue,_std::allocator<groundupdb::HashedValue>,_std::__detail::_Identity,_std::equal_to<groundupdb::HashedValue>,_std::hash<groundupdb::HashedValue>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_std::integral_constant<bool,_true>_>
  ::reserve((_Rehash_base<groundupdb::HashedValue,_groundupdb::HashedValue,_std::allocator<groundupdb::HashedValue>,_std::__detail::_Identity,_std::equal_to<groundupdb::HashedValue>,_std::hash<groundupdb::HashedValue>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_std::integral_constant<bool,_true>_>
             *)(this->m_recordKeys)._M_t.
               super___uniq_ptr_impl<std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>,_std::default_delete<std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>_*,_std::default_delete<std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>_>_>
               .
               super__Head_base<0UL,_std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>_*,_false>
               ._M_head_impl,
            (((recordKeys->_M_t).
              super___uniq_ptr_impl<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
              .
              super__Head_base<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_false>
             ._M_head_impl)->_M_h)._M_element_count);
  p_Var1 = &(((recordKeys->_M_t).
              super___uniq_ptr_impl<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
              .
              super__Head_base<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_false>
             ._M_head_impl)->_M_h)._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    this_00 = (_Insert<groundupdb::HashedValue,_groundupdb::HashedValue,_std::allocator<groundupdb::HashedValue>,_std::__detail::_Identity,_std::equal_to<groundupdb::HashedValue>,_std::hash<groundupdb::HashedValue>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
               *)(this->m_recordKeys)._M_t.
                 super___uniq_ptr_impl<std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>,_std::default_delete<std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>_*,_std::default_delete<std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>_>_>
                 .
                 super__Head_base<0UL,_std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>_*,_false>
                 ._M_head_impl;
    groundupdb::HashedValue::HashedValue(&HStack_58,(EncodedValue *)(p_Var1 + 1));
    std::__detail::
    _Insert<groundupdb::HashedValue,_groundupdb::HashedValue,_std::allocator<groundupdb::HashedValue>,_std::__detail::_Identity,_std::equal_to<groundupdb::HashedValue>,_std::hash<groundupdb::HashedValue>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
    ::insert(this_00,&HStack_58);
    groundupdb::HashedValue::~HashedValue(&HStack_58);
  }
  return;
}

Assistant:

DefaultQueryResult::DefaultQueryResult(Set&& recordKeys)
  : m_recordKeys(std::make_unique<std::unordered_set<HashedKey>>())
{
  m_recordKeys->reserve(recordKeys->size());
  for (auto it = recordKeys->begin(); it != recordKeys->end(); it++) {
    m_recordKeys->insert(HashedKey(*it));
  }
}